

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::InitMaterialDataT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,
          map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
          *dataVec,TPZVec<long> *indices)

{
  _Rb_tree_header *p_Var1;
  TPZCompEl *pTVar2;
  int64_t iVar3;
  long lVar4;
  int *piVar5;
  TPZGeoEl *pTVar6;
  mapped_type *pmVar7;
  long *plVar8;
  _Rb_tree_node_base *p_Var9;
  undefined8 uVar10;
  int64_t iVar11;
  long lVar12;
  long lVar13;
  map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
  *__range2;
  TPZVec<int> nshape;
  key_type local_6c;
  map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
  *local_68;
  int64_t local_60;
  TPZVec<int> local_58;
  int64_t local_38;
  
  iVar11 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  local_68 = dataVec;
  local_60 = iVar11;
  if (indices == (TPZVec<long> *)0x0) {
    TPZVec<int>::TPZVec(&local_58,iVar11);
    if (0 < iVar11) {
      lVar13 = 0;
      lVar12 = 0;
      do {
        pTVar2 = *(TPZCompEl **)
                  ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar13);
        if (pTVar2 != (TPZCompEl *)0x0) {
          pTVar6 = TPZCompEl::Reference(pTVar2);
          iVar3 = pTVar6->fId;
          local_6c = (key_type)lVar12;
          pmVar7 = std::
                   map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                   ::operator[](local_68,&local_6c);
          iVar11 = local_60;
          (pmVar7->super_TPZMaterialData).gelElId = (int)iVar3;
          lVar4 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                           lVar13);
          if ((lVar4 != 0) &&
             (plVar8 = (long *)__dynamic_cast(lVar4,&TPZCompEl::typeinfo,
                                              &TPZInterpolationSpace::typeinfo,0),
             plVar8 != (long *)0x0)) {
            local_6c = (key_type)lVar12;
            pmVar7 = std::
                     map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                     ::operator[](local_68,&local_6c);
            (**(code **)(*plVar8 + 0x298))(plVar8,pmVar7);
          }
        }
        lVar12 = lVar12 + 1;
        lVar13 = lVar13 + 0x10;
      } while (iVar11 != lVar12);
    }
    local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_58.fStore != (int *)0x0) {
      operator_delete__(local_58.fStore);
    }
  }
  else {
    iVar11 = indices->fNElements;
    TPZVec<int>::TPZVec(&local_58,iVar11);
    local_38 = iVar11;
    if (0 < iVar11) {
      lVar12 = 0;
      do {
        lVar13 = indices->fStore[lVar12];
        pTVar2 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore[lVar13].fEl;
        if (pTVar2 != (TPZCompEl *)0x0) {
          pTVar6 = TPZCompEl::Reference(pTVar2);
          iVar11 = pTVar6->fId;
          local_6c = (key_type)lVar13;
          pmVar7 = std::
                   map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                   ::operator[](local_68,&local_6c);
          (pmVar7->super_TPZMaterialData).gelElId = (int)iVar11;
          pTVar2 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore[lVar13].fEl;
          if ((pTVar2 != (TPZCompEl *)0x0) &&
             (plVar8 = (long *)__dynamic_cast(pTVar2,&TPZCompEl::typeinfo,
                                              &TPZInterpolationSpace::typeinfo,0),
             plVar8 != (long *)0x0)) {
            local_6c = (key_type)lVar13;
            pmVar7 = std::
                     map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                     ::operator[](local_68,&local_6c);
            (**(code **)(*plVar8 + 0x298))(plVar8,pmVar7);
          }
        }
        lVar12 = lVar12 + 1;
      } while (local_38 != lVar12);
    }
    local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    iVar11 = local_60;
    if (local_58.fStore != (int *)0x0) {
      operator_delete__(local_58.fStore);
      iVar11 = local_60;
    }
  }
  if ((int)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.super_TPZVec<int>.fNElements == 0
     ) {
    local_58._vptr_TPZVec = (_func_int **)CONCAT44(local_58._vptr_TPZVec._4_4_,1);
    TPZManVector<int,_5>::Resize
              (&(this->super_TPZMultiphysicsElement).fActiveApproxSpace,iVar11,(int *)&local_58);
  }
  p_Var9 = (local_68->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_68->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    piVar5 = (this->super_TPZMultiphysicsElement).fActiveApproxSpace.super_TPZVec<int>.fStore;
    do {
      p_Var9[0x1c9].field_0x6 = piVar5[(int)p_Var9[1]._M_color] != 0;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  uVar10 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))
                     (this);
  plVar8 = (long *)__dynamic_cast(uVar10,&TPZMaterial::typeinfo,
                                  &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
  (**(code **)(*plVar8 + 0x58))(plVar8,local_68);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitMaterialDataT(std::map<int, TPZMaterialDataT<TVar> > &dataVec, TPZVec<int64_t> *indices)
{
    int64_t nref = this->fElementVec.size();
    
//#ifdef PZDEBUG
//    if (nref != dataVec.size()) {
//        PZError << "Error at " << __PRETTY_FUNCTION__ << " The number of materials can not be different from the size of the fElementVec !\n";
//        DebugStop();
//    }
//#endif
    if(indices){
        int64_t nindices = indices->size();
        TPZVec<int> nshape(nindices);
        for (int64_t iref = 0; iref <nindices; iref++) {
            int64_t indiciref = indices->operator[](iref);
            if(fElementVec[indiciref])
            {
                dataVec[indiciref].gelElId = fElementVec[indiciref].Element()->Reference()->Id();
            }
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[indiciref].Element());
            if (!msp) {
                continue;
            }
            // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
            msp->InitMaterialData(dataVec[indiciref]);
        }
    }else{
        TPZVec<int> nshape(nref);
        for (int64_t iref = 0; iref < nref; iref++)
        {
            if(fElementVec[iref])
            {
                dataVec[iref].gelElId = fElementVec[iref].Element()->Reference()->Id();
            }
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
            if (!msp) {
                continue;
            }
            // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
            msp->InitMaterialData(dataVec[iref]);
        }
    }
    
    int n_active_approx_spaces = fActiveApproxSpace.size();
    if (n_active_approx_spaces == 0) { /// it preserves the integrity for old version of multiphycis codes.
        fActiveApproxSpace.Resize(nref, 1);
    }
    
    for (auto &it : dataVec) {
        it.second.fActiveApproxSpace = fActiveApproxSpace[it.first];
    }
    auto * mat =
        dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(this->Material());
    mat->FillDataRequirements(dataVec);
    
}